

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPlotIO.cpp
# Opt level: O1

void __thiscall NaDPlotFile::WriteDPlotFile(NaDPlotFile *this)

{
  NaDynAr<NaVector> *pNVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  FILE *pFVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 *puVar11;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined8 uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  
  fprintf((FILE *)this->fp,"%s\n","DPLOT/W v1.2");
  fprintf((FILE *)this->fp,"dx\n%u\n",(ulong)(uint)(this->aVars).nItems);
  if ((this->aVars).nItems == 0) {
    return;
  }
  if (0 < (this->aVars).nItems) {
    pNVar1 = &this->aVars;
    uVar13 = 0;
    do {
      iVar8 = (*(this->super_NaDataFile)._vptr_NaDataFile[7])(this);
      auVar6 = SEXT816(CONCAT44(extraout_var,iVar8)) * SEXT816(0x6666666666666667);
      iVar15 = (int)(auVar6._8_8_ >> 1) - (auVar6._12_4_ >> 0x1f);
      uVar9 = (*(this->super_NaDataFile)._vptr_NaDataFile[7])(this);
      pFVar5 = (FILE *)this->fp;
      iVar8 = (*(this->super_NaDataFile)._vptr_NaDataFile[7])(this);
      fprintf(pFVar5,"%lu\n",CONCAT44(extraout_var_00,iVar8));
      if (0 < iVar15) {
        iVar14 = 4;
        iVar8 = iVar15;
        do {
          pFVar5 = (FILE *)this->fp;
          iVar10 = (*(this->aVars)._vptr_NaDynAr[0xf])(pNVar1,uVar13);
          puVar11 = (undefined8 *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar10) + 0x40))
                              ((long *)CONCAT44(extraout_var_01,iVar10),iVar14 + -4);
          uVar12 = *puVar11;
          iVar10 = (*(this->aVars)._vptr_NaDynAr[0xf])(pNVar1,uVar13);
          puVar11 = (undefined8 *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar10) + 0x40))
                              ((long *)CONCAT44(extraout_var_02,iVar10),iVar14 + -3);
          uVar2 = *puVar11;
          iVar10 = (*(this->aVars)._vptr_NaDynAr[0xf])(pNVar1,uVar13);
          puVar11 = (undefined8 *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar10) + 0x40))
                              ((long *)CONCAT44(extraout_var_03,iVar10),iVar14 + -2);
          uVar3 = *puVar11;
          iVar10 = (*(this->aVars)._vptr_NaDynAr[0xf])(pNVar1,uVar13);
          puVar11 = (undefined8 *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar10) + 0x40))
                              ((long *)CONCAT44(extraout_var_04,iVar10),iVar14 + -1);
          uVar4 = *puVar11;
          iVar10 = (*(this->aVars)._vptr_NaDynAr[0xf])(pNVar1,uVar13);
          puVar11 = (undefined8 *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar10) + 0x40))
                              ((long *)CONCAT44(extraout_var_05,iVar10),iVar14);
          fprintf(pFVar5,"%g,%g,%g,%g,%g\n",uVar12,uVar2,uVar3,uVar4,*puVar11);
          iVar14 = iVar14 + 5;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      uVar7 = iVar15 * 5;
      if (uVar7 != uVar9) {
        if ((int)(uVar9 + ~uVar7) < 1) {
          iVar8 = 0;
        }
        else {
          iVar8 = 0;
          do {
            pFVar5 = (FILE *)this->fp;
            iVar15 = (*(this->aVars)._vptr_NaDynAr[0xf])(pNVar1,uVar13);
            puVar11 = (undefined8 *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar15) + 0x40))
                                ((long *)CONCAT44(extraout_var_06,iVar15),uVar7 + iVar8);
            fprintf(pFVar5,"%g,",*puVar11);
            iVar8 = iVar8 + 1;
          } while (uVar9 + ~uVar7 != iVar8);
        }
        pFVar5 = (FILE *)this->fp;
        iVar15 = (*(this->aVars)._vptr_NaDynAr[0xf])(pNVar1,uVar13);
        puVar11 = (undefined8 *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar15) + 0x40))
                            ((long *)CONCAT44(extraout_var_07,iVar15),iVar8 + uVar7);
        fprintf(pFVar5,"%g\n",*puVar11);
      }
      pFVar5 = (FILE *)this->fp;
      iVar8 = (*(this->super_NaDataFile)._vptr_NaDataFile[7])(this);
      fprintf(pFVar5,"0,%ld\n",CONCAT44(extraout_var_08,iVar8) + -1);
      fputs(" 1    0\n",(FILE *)this->fp);
      pFVar5 = (FILE *)this->fp;
      iVar8 = (*(this->aVarNames)._vptr_NaDynAr[0xf])(&this->aVarNames,uVar13);
      fprintf(pFVar5,"%s\n\n",*(undefined8 *)CONCAT44(extraout_var_09,iVar8));
      uVar9 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar9;
    } while ((int)uVar9 < (this->aVars).nItems);
  }
  pFVar5 = (FILE *)this->fp;
  iVar15 = 0;
  iVar8 = (*(this->super_NaDataFile)._vptr_NaDataFile[0xb])(this,0);
  fprintf(pFVar5,"%s\n",CONCAT44(extraout_var_10,iVar8));
  pFVar5 = (FILE *)this->fp;
  iVar8 = (*(this->super_NaDataFile)._vptr_NaDataFile[0xb])(this,1);
  fprintf(pFVar5,"%s\n",CONCAT44(extraout_var_11,iVar8));
  fwrite("\n\n",2,1,(FILE *)this->fp);
  fwrite("     1\n0.0,0.0\nDate\n           1\nGrid Type\n01\n",0x2e,1,(FILE *)this->fp);
  fwrite("LineWidths\n",0xb,1,(FILE *)this->fp);
  if (0 < (this->aVars).nItems) {
    do {
      fwrite(" 10",3,1,(FILE *)this->fp);
      iVar15 = iVar15 + 1;
    } while (iVar15 < (this->aVars).nItems);
  }
  fputc(10,(FILE *)this->fp);
  fwrite("PointSizes\n 7\n 10 18 14 14 14 11 10\n",0x24,1,(FILE *)this->fp);
  fwrite("SymbolSizes\n",0xc,1,(FILE *)this->fp);
  if (0 < (this->aVars).nItems) {
    iVar8 = 0;
    do {
      uVar12 = 0;
      if (iVar8 == 0) {
        uVar12 = 0x7d;
      }
      fprintf((FILE *)this->fp," %3d",uVar12);
      iVar8 = iVar8 + 1;
    } while (iVar8 < (this->aVars).nItems);
  }
  fputc(10,(FILE *)this->fp);
  iVar8 = (*(this->super_NaDataFile)._vptr_NaDataFile[0xb])(this,2);
  if (*(char *)CONCAT44(extraout_var_12,iVar8) != '\0') {
    pFVar5 = (FILE *)this->fp;
    iVar8 = (*(this->super_NaDataFile)._vptr_NaDataFile[0xb])(this,2);
    fprintf(pFVar5,"Title3\n%s\n",CONCAT44(extraout_var_13,iVar8));
  }
  fwrite("Stop\n",5,1,(FILE *)this->fp);
  return;
}

Assistant:

void
NaDPlotFile::WriteDPlotFile ()
{
    // Magic
    fprintf(fp, "%s\n", NaIO_DPLOT_MAGIC);

    // Data format description, number of series
    fprintf(fp, "dx\n%u\n", aVars.count());

    if(0 == aVars.count()){
        return;
    }

    int iVar;
    for(iVar = 0; iVar < aVars.count(); ++iVar){
        int     nBy5, nRest, iSer;
        nBy5 = CountOfRecord() / 5;
        nRest = CountOfRecord() - 5 * nBy5;

        // Number of values in the series
        fprintf(fp, "%lu\n", CountOfRecord());
        // Values in the series
        for(iSer = 0; iSer < nBy5; ++iSer){
            fprintf(fp, "%g,%g,%g,%g,%g\n", aVars[iVar][5*iSer+0],
                    aVars[iVar][5*iSer+1], aVars[iVar][5*iSer+2],
                    aVars[iVar][5*iSer+3], aVars[iVar][5*iSer+4]);
        }
        if(nRest != 0){
            for(iSer = 0; iSer < nRest - 1; ++iSer){
                fprintf(fp, "%g,", aVars[iVar][5 * nBy5 + iSer]);
            }
            fprintf(fp, "%g\n", aVars[iVar][5 * nBy5 + iSer]);
        }
        // Argument range for the series
        fprintf(fp, "0,%ld\n", CountOfRecord() - 1);
        // Type of curve -- solid line without knots
        fputs(" 1    0\n", fp);
        // Name of the series
        fprintf(fp, "%s\n\n", aVarNames[iVar]);
    }

    // Titles
    fprintf(fp, "%s\n", GetTitle(0));
    fprintf(fp, "%s\n", GetTitle(1));

    fprintf(fp, "\n\n");

    fprintf(fp, "     1\n0.0,0.0\nDate\n           1\nGrid Type\n01\n");

    // For each series
    fprintf(fp, "LineWidths\n");
    for(iVar = 0; iVar < aVars.count(); ++iVar){
        fprintf(fp, " 10");
    }
    fprintf(fp, "\n");

    fprintf(fp, "PointSizes\n 7\n 10 18 14 14 14 11 10\n");

    fprintf(fp, "SymbolSizes\n");
    for(iVar = 0; iVar < aVars.count(); ++iVar){
        if(0 == iVar)
            fprintf(fp, " %3d", 125);
        else
            fprintf(fp, " %3d", 0);
    }
    fprintf(fp, "\n");

    if('\0' != GetTitle(2)[0])
        fprintf(fp, "Title3\n%s\n", GetTitle(2));

    // End of file
    fprintf(fp, "Stop\n");
}